

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socketio_berkeley.c
# Opt level: O2

void destroy_socket_io_instance(SOCKET_IO_INSTANCE *instance)

{
  if (instance->dns_resolver != (DNSRESOLVER_HANDLE)0x0) {
    dns_resolver_destroy(instance->dns_resolver);
  }
  free(instance->hostname);
  free(instance->target_mac_address);
  if (instance->pending_io_list != (SINGLYLINKEDLIST_HANDLE)0x0) {
    singlylinkedlist_destroy(instance->pending_io_list);
  }
  free(instance);
  return;
}

Assistant:

static void destroy_socket_io_instance(SOCKET_IO_INSTANCE* instance)
{
    if (instance->dns_resolver != NULL)
    {
        dns_resolver_destroy(instance->dns_resolver);
    }

    free(instance->hostname);
    free(instance->target_mac_address);

    if (instance->pending_io_list != NULL)
    {
        singlylinkedlist_destroy(instance->pending_io_list);
    }

    free(instance);
}